

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint addChunk_PLTE(ucvector *out,LodePNGColorMode *info)

{
  uint uVar1;
  undefined1 local_40 [8];
  ucvector PLTE;
  size_t i;
  uint error;
  LodePNGColorMode *info_local;
  ucvector *out_local;
  
  ucvector_init((ucvector *)local_40);
  for (PLTE.allocsize = 0; PLTE.allocsize < info->palettesize << 2;
      PLTE.allocsize = PLTE.allocsize + 1) {
    if ((PLTE.allocsize & 3) != 3) {
      ucvector_push_back((ucvector *)local_40,info->palette[PLTE.allocsize]);
    }
  }
  uVar1 = addChunk(out,"PLTE",(uchar *)local_40,(size_t)PLTE.data);
  ucvector_cleanup(local_40);
  return uVar1;
}

Assistant:

static unsigned addChunk_PLTE(ucvector* out, const LodePNGColorMode* info)
{
  unsigned error = 0;
  size_t i;
  ucvector PLTE;
  ucvector_init(&PLTE);
  for(i = 0; i < info->palettesize * 4; i++)
  {
    /*add all channels except alpha channel*/
    if(i % 4 != 3) ucvector_push_back(&PLTE, info->palette[i]);
  }
  error = addChunk(out, "PLTE", PLTE.data, PLTE.size);
  ucvector_cleanup(&PLTE);

  return error;
}